

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
ninx::parser::element::Block::make_text_block(Block *parent,string *text)

{
  pointer *__args;
  pointer pBVar1;
  unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
  local_48;
  undefined1 local_40 [8];
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  block_statements;
  __single_object element;
  string *text_local;
  Block *parent_local;
  __single_object *block;
  
  __args = &block_statements.
            super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::make_unique<ninx::parser::element::TextElement,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
  std::
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ::vector((vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
            *)local_40);
  std::
  unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
  ::
  unique_ptr<ninx::parser::element::TextElement,std::default_delete<ninx::parser::element::TextElement>,void>
            ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
              *)&local_48,
             (unique_ptr<ninx::parser::element::TextElement,_std::default_delete<ninx::parser::element::TextElement>_>
              *)__args);
  std::
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ::push_back((vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
               *)local_40,(value_type *)&local_48);
  std::
  unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
  ::~unique_ptr(&local_48);
  std::
  make_unique<ninx::parser::element::Block,std::vector<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>,std::allocator<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>>>
            ((vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
              *)parent);
  pBVar1 = std::
           unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ::operator->((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                         *)parent);
  (*(pBVar1->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[4])(pBVar1,text);
  std::
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
             *)local_40);
  std::
  unique_ptr<ninx::parser::element::TextElement,_std::default_delete<ninx::parser::element::TextElement>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::TextElement,_std::default_delete<ninx::parser::element::TextElement>_>
                 *)&block_statements.
                    super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
            )parent;
}

Assistant:

std::unique_ptr<ninx::parser::element::Block>
ninx::parser::element::Block::make_text_block(Block *parent, const std::string &text) {
    auto element{std::make_unique<TextElement>(text)};
    std::vector<std::unique_ptr<Statement>> block_statements;
    block_statements.push_back(std::move(element));

    auto block{std::make_unique<Block>(std::move(block_statements))};
    block->set_parent(parent);

    return block;
}